

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.h
# Opt level: O1

void __thiscall rcnb::decoder::decode(decoder *this,wistream *istream_in,ostream *ostream_in)

{
  char *plaintext_out;
  wchar_t *code_in;
  ptrdiff_t pVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  rcnb_init_decodestate(&this->_state);
  uVar4 = (ulong)this->_buffersize;
  uVar3 = uVar4;
  if ((long)uVar4 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  uVar2 = uVar4 * 0xc;
  if ((long)uVar4 < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  plaintext_out = (char *)operator_new__(uVar3);
  code_in = (wchar_t *)operator_new__(uVar2);
  do {
    std::wistream::read((wchar_t *)istream_in,(long)code_in);
    pVar1 = rcnb_decode_block(code_in,*(size_t *)(istream_in + 8),plaintext_out,&this->_state);
    std::ostream::write((char *)ostream_in,(long)plaintext_out);
    if (pVar1 < 1) break;
  } while (*(int *)(istream_in + *(long *)(*(long *)istream_in + -0x18) + 0x20) == 0);
  rcnb_decode_blockend(plaintext_out,&this->_state);
  std::ostream::write((char *)ostream_in,(long)plaintext_out);
  operator_delete__(code_in);
  operator_delete__(plaintext_out);
  return;
}

Assistant:

void decode(std::wistream& istream_in, std::ostream& ostream_in)
    {
        initialize();

        const int N = _buffersize;
        char* plaintext = new char[N];
        auto code = new wchar_t[3 * N];
        long plainlength;
        long codelength;

        do {
            istream_in.read(code, N);
            codelength = istream_in.gcount();

            plainlength = decode(code, codelength, plaintext);
            ostream_in.write(plaintext, plainlength);
        } while (istream_in.good() && plainlength > 0);

        plainlength = decode_end(plaintext);
        ostream_in.write(plaintext, plainlength);

        delete[] code;
        delete[] plaintext;
    }